

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

UINT16 TPMS_ALG_PROPERTY_Array_Marshal
                 (TPMS_ALG_PROPERTY *source,BYTE **buffer,INT32 *size,INT32 count)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = 0;
  uVar1 = uVar2;
  if (0 < count) {
    uVar2 = (ulong)(uint)count;
    uVar1 = uVar2;
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    TPMS_ALG_PROPERTY_Marshal(source,buffer,size);
    source = source + 1;
  }
  return (short)uVar1 * 6;
}

Assistant:

UINT16
TPMS_ALG_PROPERTY_Array_Marshal(TPMS_ALG_PROPERTY *source, BYTE **buffer, INT32 *size, INT32 count)
{
    UINT16    result = 0;
    INT32 i;
    for(i = 0; i < count; i++) {
        result = (UINT16)(result + TPMS_ALG_PROPERTY_Marshal(&source[i], buffer, size));
    }
    return result;
}